

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new.cc
# Opt level: O0

void operator_delete(void *p,size_t size)

{
  bool bVar1;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *pDVar2;
  conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *pcVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  unsigned_long uVar7;
  reference pvVar8;
  reference this;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *in_RSI;
  PagemapEntry *in_RDI;
  undefined8 *in_FS_OFFSET;
  PagemapEntry *entry;
  CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  p_tame;
  AllocWild<void> p_wild;
  CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  cp;
  SlabMetadata *meta;
  bool result;
  int64_t size_1;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  r;
  size_t szix;
  size_t ix_1;
  size_t ix_way_1;
  size_t victim_size;
  size_t victim_ix;
  size_t ix;
  size_t ix_way;
  size_t ix_set;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *entry_1;
  CapPtr<snmalloc::BatchedRemoteMessage,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  rmsg;
  size_type in_stack_fffffffffffffab8;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *in_stack_fffffffffffffac0;
  alloc_id_t in_stack_fffffffffffffac8;
  RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *key_tweak;
  CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  in_stack_fffffffffffffad0;
  FreeListKey *pFVar9;
  Alloc<RemoteMessage> in_stack_fffffffffffffad8;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  in_stack_fffffffffffffae0;
  RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *pRVar10;
  Builder<false,_false,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *in_stack_fffffffffffffae8;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  in_stack_fffffffffffffaf0;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *pRVar11;
  BackendSlabMetadata *in_stack_fffffffffffffaf8;
  PagemapEntry *in_stack_fffffffffffffb00;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *in_stack_fffffffffffffb08;
  Alloc<void> in_stack_fffffffffffffb10;
  address_t in_stack_fffffffffffffb20;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this_00;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *key;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this_01;
  Alloc<void> p_00;
  PagemapEntry *local_478;
  PagemapEntry *local_470;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_460;
  PagemapEntry **local_458;
  PagemapEntry *local_448;
  PagemapEntry *local_440;
  PagemapEntry *local_438;
  ulong local_430;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_428;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_420;
  PagemapEntry *local_418;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_410;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_408;
  ulong local_400;
  ulong local_3f8;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_3f0;
  ulong local_3e8;
  PagemapEntry *local_3e0;
  PagemapEntry **local_3d8;
  ulong local_3c8;
  ulong local_3c0;
  PagemapEntry **local_3b0;
  PagemapEntry *local_3a8;
  PagemapEntry *local_3a0;
  undefined1 local_398 [8];
  PagemapEntry *local_390;
  undefined1 *local_388;
  undefined1 local_368 [16];
  undefined1 *local_358;
  LocalState *local_350;
  PagemapEntry *local_348;
  PagemapEntry *local_340;
  LocalState **local_338;
  undefined1 local_328 [16];
  undefined1 *local_318;
  PagemapEntry *local_310 [2];
  PagemapEntry *local_300;
  PagemapEntry *local_2f8;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_2f0;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_2e8;
  PagemapEntry *local_2e0 [3];
  PagemapEntry **local_2c8;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_2a0;
  undefined1 local_291;
  size_t local_290;
  long local_288;
  undefined2 local_27a;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_278;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_270;
  FreeListKey *local_268;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_260;
  size_t local_258;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_250;
  PagemapEntry *local_240;
  PagemapEntry **local_238;
  PagemapEntry **local_230;
  PagemapEntry **local_220;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_218;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_210;
  ulong local_208;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
  *local_200;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_1f8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_1f0;
  PagemapEntry *local_1e8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_1e0;
  LocalEntropy *local_1d8;
  FreeListKey *local_1d0;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_1c8;
  PagemapEntry *local_1c0;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_1b0;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_1a8;
  enable_if_t<_false,_size_t> local_1a0;
  ulong local_198;
  ulong local_190;
  enable_if_t<_false,_size_t> local_188;
  ulong local_180;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_178;
  long local_170;
  ulong local_168;
  ulong local_160;
  LocalEntropy *local_158;
  FreeListKey *local_150;
  RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *local_148;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_140;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_138;
  FreeListKey *local_130;
  FreeListKey *local_128;
  FreeListKey *local_120;
  FreeListKey *local_118;
  FreeListKey *local_110;
  FreeListKey *local_108;
  FreeListKey *local_100;
  RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *local_f8;
  FreeListKey *local_f0;
  FreeListKey *local_e8;
  FreeListKey *local_e0;
  FreeListKey *local_d8;
  BatchedRemoteMessage *local_c8;
  BatchedRemoteMessage *local_c0;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_b8
  ;
  BatchedRemoteMessage *local_b0;
  ulong local_a8;
  RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *local_a0;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_98;
  BatchedRemoteMessage *local_90;
  BatchedRemoteMessage *local_88;
  BatchedRemoteMessage *local_80;
  BatchedRemoteMessage **local_78;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_70
  ;
  ulong local_68;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_60
  ;
  value_type_conflict local_58;
  BatchedRemoteMessage *local_50;
  FreeListKey *local_48;
  ulong local_40;
  RemoteDeallocCacheBatchingImpl<snmalloc::StandardConfigClientMeta<>_> *local_38;
  value_type_conflict local_30;
  FreeListKey *local_28;
  undefined1 local_20 [8];
  undefined1 local_18 [8];
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_8 = local_18;
  local_10 = local_20;
  this_00 = *(Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **)
             *in_FS_OFFSET;
  local_358 = local_368;
  this_01 = in_RSI;
  p_00.unsafe_capptr = in_RDI;
  local_470 = in_RDI;
  local_460 = this_00;
  local_350 = snmalloc::
              Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
              backend_state_ptr(this_00);
  local_348 = local_470;
  local_338 = &local_350;
  local_238 = &local_348;
  local_318 = local_328;
  local_340 = local_470;
  local_478 = local_470;
  local_3e0 = local_470;
  local_3d8 = &local_3e0;
  pDVar2 = snmalloc::
           FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
           ::get<false>(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  pcVar3 = snmalloc::
           Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
           public_state(this_00);
  local_3f8 = (pDVar2->
              super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
              ).super_MetaEntryBase.remote_and_sizeclass;
  local_410 = pDVar2;
  local_3f0 = pDVar2;
  if (pcVar3 == (conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *)
                (local_3f8 & 0xffffffffffffff80)) {
    local_458 = &local_478;
    local_310[0] = local_478;
    local_220 = local_310;
    local_418 = local_478;
    local_430 = (pDVar2->
                super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                ).super_MetaEntryBase.meta & 0xfffffffffffffffe;
    local_3b0 = &local_418;
    local_3a0 = local_478;
    local_388 = local_398;
    local_3a8 = local_478;
    local_438 = local_478;
    local_440 = local_478;
    local_428 = pDVar2;
    local_420 = this_00;
    local_408 = pDVar2;
    local_400 = local_430;
    local_3e8 = local_430;
    local_3c8 = local_430;
    local_3c0 = local_430;
    local_390 = local_3a0;
    snmalloc::freelist::
    Builder<false,_false,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
    ::add(in_stack_fffffffffffffae8,in_stack_fffffffffffffaf0,
          (FreeListKey *)in_stack_fffffffffffffae0.unsafe_capptr,
          (address_t)in_stack_fffffffffffffad8.unsafe_capptr,
          (LocalEntropy *)in_stack_fffffffffffffad0.unsafe_capptr);
    bVar1 = snmalloc::
            FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
            ::return_object((FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                             *)0x13f134);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_448 = local_418;
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_local_object_slow
                (in_stack_fffffffffffffb08,in_stack_fffffffffffffb10,in_stack_fffffffffffffb00,
                 in_stack_fffffffffffffaf8);
    }
  }
  else {
    local_2e0[0] = local_478;
    local_208 = (pDVar2->
                super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                ).super_MetaEntryBase.remote_and_sizeclass;
    if ((local_208 & 0xffffffffffffff80) != 0) {
      local_2c8 = local_2e0;
      local_240 = local_478;
      local_230 = &local_240;
      pRVar11 = &this_00->remote_dealloc_cache;
      local_27a = 1;
      lVar4 = 1;
      key = this_00;
      local_2f0 = pDVar2;
      local_2e8 = this_00;
      local_278 = pDVar2;
      local_270 = pRVar11;
      local_260 = pDVar2;
      local_250 = pDVar2;
      local_218 = pDVar2;
      local_210 = pDVar2;
      local_200 = pDVar2;
      local_290 = (size_t)snmalloc::sizeclass_t::from_raw(in_stack_fffffffffffffab8);
      local_258 = local_290;
      sVar5 = snmalloc::sizeclass_full_to_size((sizeclass_t)in_stack_fffffffffffffae0.unsafe_capptr)
      ;
      local_288 = lVar4 * sVar5;
      local_291 = local_288 < pRVar11->capacity;
      if ((bool)local_291) {
        pRVar11->capacity = pRVar11->capacity - local_288;
        pRVar11 = &this_00->remote_dealloc_cache;
        local_2a0 = local_2f0;
        local_268 = (FreeListKey *)
                    ((local_2f0->
                     super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                     ).super_MetaEntryBase.meta & 0xfffffffffffffffe);
        local_2f8 = local_2e0[0];
        local_1d8 = &this_00->entropy;
        local_1c0 = local_2e0[0];
        local_1e8 = local_2e0[0];
        local_1d0 = local_268;
        local_1c8 = pRVar11;
        local_1f0 = (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                     *)snmalloc::freelist::Object::
                       make<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
                                 (in_stack_fffffffffffffad0);
        pRVar10 = &pRVar11->batching;
        local_150 = local_1d0;
        local_158 = local_1d8;
        local_100 = local_1d0;
        local_f0 = local_1d0;
        local_e0 = local_1d0;
        local_e8 = local_1d0;
        uVar6 = ((ulong)local_1d0 >> 3) * 0x7efb352d >> 0x10;
        local_1f8 = pRVar11;
        local_1e0 = local_1f0;
        local_148 = pRVar10;
        local_140 = pRVar11;
        local_138 = local_1f0;
        local_f8 = pRVar10;
        uVar7 = snmalloc::bits::mask_bits<unsigned_long,unsigned_long>(0x13f4f8);
        local_160 = uVar6 & uVar7;
        for (local_168 = 0; local_168 < 2; local_168 = local_168 + 1) {
          local_170 = local_160 + local_168;
          local_d8 = local_150;
          pFVar9 = local_150;
          pvVar8 = std::array<unsigned_long,_16UL>::operator[]
                             ((array<unsigned_long,_16UL> *)in_stack_fffffffffffffac0,
                              in_stack_fffffffffffffab8);
          if (pFVar9 == (FreeListKey *)*pvVar8) {
            std::
            array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
            ::operator[]((array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
                          *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
            local_178 = local_138;
            local_128 = local_150;
            local_110 = local_150;
            local_120 = local_150;
            snmalloc::freelist::
            Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
            ::add<false>((Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                          *)in_stack_fffffffffffffad8.unsafe_capptr,in_stack_fffffffffffffae0,
                         (FreeListKey *)in_stack_fffffffffffffad0.unsafe_capptr,
                         in_stack_fffffffffffffac8);
            return;
          }
        }
        local_180 = local_160;
        local_188 = 0;
        for (local_190 = 0; local_190 < 2; local_190 = local_190 + 1) {
          local_198 = local_160 + local_190;
          pvVar8 = std::array<unsigned_long,_16UL>::operator[]
                             ((array<unsigned_long,_16UL> *)in_stack_fffffffffffffac0,
                              in_stack_fffffffffffffab8);
          if (*pvVar8 == 0) {
            local_180 = local_198;
            break;
          }
          std::
          array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
          ::operator[]((array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
                        *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
          local_1a0 = snmalloc::freelist::
                      Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                      ::extract_segment_length<false>
                                ((Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                                  *)0x13f6c2);
          if (local_188 < local_1a0) {
            local_180 = local_198;
            local_188 = local_1a0;
          }
        }
        pvVar8 = std::array<unsigned_long,_16UL>::operator[]
                           ((array<unsigned_long,_16UL> *)in_stack_fffffffffffffac0,
                            in_stack_fffffffffffffab8);
        key_tweak = pRVar10;
        if (*pvVar8 != 0) {
          local_1a8 = local_140;
          local_98 = local_140;
          local_a8 = local_180;
          local_a0 = pRVar10;
          in_stack_fffffffffffffad8.unsafe_capptr =
               (BatchedRemoteMessage *)
               std::
               array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
               ::operator[]((array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
                             *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
          pvVar8 = std::array<unsigned_long,_16UL>::operator[]
                             ((array<unsigned_long,_16UL> *)in_stack_fffffffffffffac0,
                              in_stack_fffffffffffffab8);
          local_58 = *pvVar8;
          local_c0 = (BatchedRemoteMessage *)
                     snmalloc::BatchedRemoteMessage::mk_from_freelist_builder
                               ((Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                                 *)in_RSI,(FreeListKey *)key,in_stack_fffffffffffffb20);
          local_78 = &local_88;
          local_b0 = local_c0;
          local_90 = local_c0;
          local_88 = local_c0;
          local_80 = local_c0;
          local_50 = local_c0;
          local_b8 = snmalloc::
                     FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
                     ::get<false>(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
          local_68 = (local_b8->
                     super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                     ).super_MetaEntryBase.remote_and_sizeclass;
          local_70 = local_b8;
          local_60 = local_b8;
          snmalloc::RemoteAllocator::trunc_id((RemoteAllocator *)(local_68 & 0xffffffffffffff80));
          local_c8 = local_b0;
          snmalloc::
          RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
          ::dealloc<9216UL>::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffad0.unsafe_capptr,
                     in_stack_fffffffffffffac8,in_stack_fffffffffffffad8);
          pvVar8 = std::array<unsigned_long,_16UL>::operator[]
                             ((array<unsigned_long,_16UL> *)in_stack_fffffffffffffac0,
                              in_stack_fffffffffffffab8);
          *pvVar8 = 0;
          in_stack_fffffffffffffae0.unsafe_capptr =
               (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                *)pRVar10;
        }
        local_40 = local_180;
        local_48 = local_150;
        local_38 = key_tweak;
        this = std::
               array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
               ::operator[]((array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
                             *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
        pvVar8 = std::array<unsigned_long,_16UL>::operator[]
                           ((array<unsigned_long,_16UL> *)this,in_stack_fffffffffffffab8);
        local_30 = *pvVar8;
        snmalloc::freelist::
        Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
        ::init(this,(EVP_PKEY_CTX *)0x0);
        local_28 = local_48;
        pFVar9 = local_48;
        pvVar8 = std::array<unsigned_long,_16UL>::operator[]
                           ((array<unsigned_long,_16UL> *)this,in_stack_fffffffffffffab8);
        *pvVar8 = (value_type_conflict)pFVar9;
        std::
        array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
        ::operator[]((array<snmalloc::freelist::Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_16UL>
                      *)this,in_stack_fffffffffffffab8);
        local_1b0 = local_138;
        local_130 = local_150;
        local_108 = local_150;
        local_118 = local_150;
        snmalloc::freelist::
        Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
        ::add<false>((Builder<false,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                      *)in_stack_fffffffffffffad8.unsafe_capptr,in_stack_fffffffffffffae0,pFVar9,
                     (address_t)key_tweak);
      }
      else {
        local_300 = local_2e0[0];
        snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
        ::dealloc_remote_slow<snmalloc::CheckInitPthread>(this_01,in_RDI,p_00);
      }
    }
  }
  return;
}

Assistant:

void operator delete(void* p, size_t size) EXCEPTSPEC
{
  snmalloc::libc::free_sized(p, size);
}